

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DGXMLScanner::scanDocTypeDecl(DGXMLScanner *this)

{
  Grammar *pGVar1;
  NameIdPool<xercesc_4_0::DTDElementDecl> *this_00;
  DocTypeHandler *pDVar2;
  GrammarResolver *this_01;
  XMLValidator *pXVar3;
  bool hasExtSubset_00;
  Janitor<xercesc_4_0::DTDElementDecl> this_02;
  bool bVar4;
  bool bVar5;
  XMLCh XVar6;
  int iVar7;
  uint uVar8;
  XMLBuffer *pXVar9;
  XMLCh *pXVar10;
  DTDElementDecl *pDVar11;
  XMLBuffer *sysIdToFill;
  XMLSize_t XVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DTDGrammar *pDVar13;
  RuntimeException *this_03;
  undefined4 extraout_var_01;
  XMLStringPool *pXVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DTDEntityDecl *this_04;
  XMLCh *local_2b8;
  MemoryManager *local_1c0;
  bool local_18a;
  DTDEntityDecl *declDTD;
  XMLCh gDTDStr [4];
  XMLCh *sysIdStr;
  XMLReader *pXStack_150;
  uint stringId;
  XMLReader *reader;
  Grammar *grammar;
  Janitor<xercesc_4_0::InputSource> janSrc;
  InputSource *srcUsed;
  ArrayJanitor<char16_t> janPubId;
  ArrayJanitor<char16_t> janSysId;
  XMLBufBid bbSysId;
  XMLBufBid bbPubId;
  DTDScanner dtdScanner;
  XMLCh *pubId;
  XMLCh *sysId;
  bool hasExtSubset;
  bool hasIntSubset;
  XMLElementDecl *elemDecl;
  Janitor<xercesc_4_0::DTDElementDecl> rootDeclJanitor;
  DTDElementDecl *rootDecl;
  MemoryManager *rootDeclMgr;
  int local_2c;
  undefined1 local_28 [3];
  bool validName;
  int colonPosition;
  XMLBufBid bbRootName;
  bool skippedSomething;
  DGXMLScanner *this_local;
  
  if ((this->super_XMLScanner).fDocTypeHandler != (DocTypeHandler *)0x0) {
    (*((this->super_XMLScanner).fDocTypeHandler)->_vptr_DocTypeHandler[0xc])();
  }
  ReaderMgr::skipPastSpaces
            (&(this->super_XMLScanner).fReaderMgr,(bool *)((long)&bbRootName.fMgr + 7),false);
  if ((bbRootName.fMgr._7_1_ & 1) == 0) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    return;
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)local_28,&(this->super_XMLScanner).fBufMgr);
  if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
    pXVar9 = XMLBufBid::getBuffer((XMLBufBid *)local_28);
    local_18a = ReaderMgr::getName(&(this->super_XMLScanner).fReaderMgr,pXVar9);
  }
  else {
    pXVar9 = XMLBufBid::getBuffer((XMLBufBid *)local_28);
    local_18a = ReaderMgr::getQName(&(this->super_XMLScanner).fReaderMgr,pXVar9,&local_2c);
  }
  if (local_18a == false) {
    bVar4 = XMLBufBid::isEmpty((XMLBufBid *)local_28);
    if (bVar4) {
      XMLScanner::emitError(&this->super_XMLScanner,NoRootElemInDOCTYPE);
    }
    else {
      pXVar10 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidRootElemInDOCTYPE,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    goto LAB_00342a59;
  }
  pXVar10 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
  XMLScanner::setRootElemName(&this->super_XMLScanner,pXVar10);
  if (((this->super_XMLScanner).fUseCachedGrammar & 1U) == 0) {
    local_1c0 = (this->super_XMLScanner).fGrammarPoolMemoryManager;
  }
  else {
    local_1c0 = (this->super_XMLScanner).fMemoryManager;
  }
  pDVar11 = (DTDElementDecl *)XMemory::operator_new(0x58,local_1c0);
  pXVar10 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
  DTDElementDecl::DTDElementDecl
            (pDVar11,pXVar10,(this->super_XMLScanner).fEmptyNamespaceId,Any,local_1c0);
  rootDeclJanitor.fData = pDVar11;
  Janitor<xercesc_4_0::DTDElementDecl>::Janitor
            ((Janitor<xercesc_4_0::DTDElementDecl> *)&elemDecl,pDVar11);
  XMLElementDecl::setCreateReason(&(rootDeclJanitor.fData)->super_XMLElementDecl,AsRootElem);
  XMLElementDecl::setExternalElemDeclaration(&(rootDeclJanitor.fData)->super_XMLElementDecl,true);
  if (((this->super_XMLScanner).fUseCachedGrammar & 1U) == 0) {
    pGVar1 = (this->super_XMLScanner).fGrammar;
    (*(pGVar1->super_XSerializable)._vptr_XSerializable[0x11])(pGVar1,rootDeclJanitor.fData,0);
    Janitor<xercesc_4_0::DTDElementDecl>::release((Janitor<xercesc_4_0::DTDElementDecl> *)&elemDecl)
    ;
  }
  else {
    this_00 = this->fDTDElemNonDeclPool;
    pXVar10 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
    pDVar11 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey(this_00,pXVar10);
    this_02 = rootDeclJanitor;
    if (pDVar11 == (DTDElementDecl *)0x0) {
      XVar12 = NameIdPool<xercesc_4_0::DTDElementDecl>::put
                         (this->fDTDElemNonDeclPool,rootDeclJanitor.fData);
      XMLElementDecl::setId(&(this_02.fData)->super_XMLElementDecl,XVar12);
      Janitor<xercesc_4_0::DTDElementDecl>::release
                ((Janitor<xercesc_4_0::DTDElementDecl> *)&elemDecl);
    }
    else {
      XVar12 = XMLElementDecl::getId(&pDVar11->super_XMLElementDecl);
      XMLElementDecl::setId(&(this_02.fData)->super_XMLElementDecl,XVar12);
    }
  }
  ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
  bVar4 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>');
  if (bVar4) {
    if ((this->super_XMLScanner).fDocTypeHandler != (DocTypeHandler *)0x0) {
      pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
      (*pDVar2->_vptr_DocTypeHandler[4])(pDVar2,rootDeclJanitor.fData,0,0,0);
    }
  }
  else {
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       (((this->super_XMLScanner).fValidate & 1U) == 0)) {
      (this->super_XMLScanner).fValidate = true;
    }
    bVar4 = false;
    hasExtSubset_00 = false;
    pubId = (XMLCh *)0x0;
    dtdScanner.fDocTypeReaderId = 0;
    DTDScanner::DTDScanner
              ((DTDScanner *)&bbPubId.fMgr,(DTDGrammar *)(this->super_XMLScanner).fGrammar,
               (this->super_XMLScanner).fDocTypeHandler,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo
              ((DTDScanner *)&bbPubId.fMgr,&this->super_XMLScanner,
               &(this->super_XMLScanner).fReaderMgr,&(this->super_XMLScanner).fBufMgr);
    XVar6 = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
    if (XVar6 == L'[') {
      bVar4 = true;
LAB_00342199:
      ArrayJanitor<char16_t>::ArrayJanitor
                ((ArrayJanitor<char16_t> *)&janPubId.fMemoryManager,pubId,
                 (this->super_XMLScanner).fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                ((ArrayJanitor<char16_t> *)&srcUsed,(char16_t *)dtdScanner.fDocTypeReaderId,
                 (this->super_XMLScanner).fMemoryManager);
      if ((this->super_XMLScanner).fDocTypeHandler != (DocTypeHandler *)0x0) {
        pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
        (*pDVar2->_vptr_DocTypeHandler[4])
                  (pDVar2,rootDeclJanitor.fData,dtdScanner.fDocTypeReaderId,pubId,(ulong)bVar4,
                   (ulong)hasExtSubset_00);
      }
      if (bVar4 == false) {
LAB_00342336:
        bVar5 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>');
        if (!bVar5) {
          bVar5 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L']');
          if ((bVar5) &&
             (bVar5 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>'), bVar5)) {
            XMLScanner::emitError(&this->super_XMLScanner,ExtraCloseSquare);
          }
          else {
            XMLScanner::emitError(&this->super_XMLScanner,UnterminatedDOCTYPE);
            ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
          }
        }
        if (hasExtSubset_00 != false) {
          janSrc.fData = (InputSource *)0x0;
          Janitor<xercesc_4_0::InputSource>::Janitor
                    ((Janitor<xercesc_4_0::InputSource> *)&grammar,(InputSource *)0x0);
          if ((((this->super_XMLScanner).fUseCachedGrammar & 1U) == 0) || (bVar4 != false)) {
LAB_003425d0:
            if ((((this->super_XMLScanner).fLoadExternalDTD & 1U) != 0) ||
               (((this->super_XMLScanner).fValidate & 1U) != 0)) {
              if (janSrc.fData == (InputSource *)0x0) {
                pXStack_150 = ReaderMgr::createReader
                                        (&(this->super_XMLScanner).fReaderMgr,pubId,
                                         (XMLCh *)dtdScanner.fDocTypeReaderId,false,
                                         RefFrom_NonLiteral,Type_General,Source_External,
                                         &janSrc.fData,
                                         (bool)((this->super_XMLScanner).fCalculateSrcOfs & 1),
                                         (this->super_XMLScanner).fLowWaterMark,
                                         (bool)((this->super_XMLScanner).
                                                fDisableDefaultEntityResolution & 1));
                Janitor<xercesc_4_0::InputSource>::reset
                          ((Janitor<xercesc_4_0::InputSource> *)&grammar,janSrc.fData);
              }
              else {
                pXStack_150 = ReaderMgr::createReader
                                        (&(this->super_XMLScanner).fReaderMgr,janSrc.fData,false,
                                         RefFrom_NonLiteral,Type_General,Source_External,
                                         (bool)((this->super_XMLScanner).fCalculateSrcOfs & 1),
                                         (this->super_XMLScanner).fLowWaterMark);
              }
              if (pXStack_150 == (XMLReader *)0x0) {
                this_03 = (RuntimeException *)__cxa_allocate_exception(0x30);
                if (janSrc.fData == (InputSource *)0x0) {
                  local_2b8 = pubId;
                }
                else {
                  iVar7 = (*(janSrc.fData)->_vptr_InputSource[5])();
                  local_2b8 = (XMLCh *)CONCAT44(extraout_var_01,iVar7);
                }
                RuntimeException::RuntimeException
                          (this_03,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                           ,0x40a,Gen_CouldNotOpenDTD,local_2b8,(XMLCh *)0x0,(XMLCh *)0x0,
                           (XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
                __cxa_throw(this_03,&RuntimeException::typeinfo,RuntimeException::~RuntimeException)
                ;
              }
              if (((this->super_XMLScanner).fToCacheGrammar & 1U) != 0) {
                pXVar14 = GrammarResolver::getStringPool((this->super_XMLScanner).fGrammarResolver);
                iVar7 = (*(janSrc.fData)->_vptr_InputSource[5])();
                uVar8 = (*(pXVar14->super_XSerializable)._vptr_XSerializable[5])
                                  (pXVar14,CONCAT44(extraout_var_02,iVar7));
                pXVar14 = GrammarResolver::getStringPool((this->super_XMLScanner).fGrammarResolver);
                gDTDStr._0_4_ =
                     (*(pXVar14->super_XSerializable)._vptr_XSerializable[10])(pXVar14,(ulong)uVar8)
                ;
                gDTDStr[2] = (short)extraout_var_03;
                gDTDStr[3] = (short)((uint)extraout_var_03 >> 0x10);
                GrammarResolver::orphanGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (XMLCh *)XMLUni::fgDTDEntityString);
                iVar7 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable).
                          _vptr_XSerializable[0x16])();
                (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x50))
                          ((long *)CONCAT44(extraout_var_04,iVar7),gDTDStr);
                GrammarResolver::putGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (this->super_XMLScanner).fGrammar);
              }
              declDTD = (DTDEntityDecl *)0x4400540044;
              this_04 = (DTDEntityDecl *)
                        XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
              DTDEntityDecl::DTDEntityDecl
                        (this_04,(XMLCh *)&declDTD,false,(this->super_XMLScanner).fMemoryManager);
              XMLEntityDecl::setSystemId((XMLEntityDecl *)this_04,pubId);
              XMLEntityDecl::setIsExternal((XMLEntityDecl *)this_04,true);
              XMLReader::setThrowAtEnd(pXStack_150,true);
              ReaderMgr::pushReaderAdoptEntity
                        (&(this->super_XMLScanner).fReaderMgr,pXStack_150,(XMLEntityDecl *)this_04,
                         true);
              DTDScanner::scanExtSubsetDecl((DTDScanner *)&bbPubId.fMgr,false,true);
            }
          }
          else {
            iVar7 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler
                      [0x11])(this,pubId,dtdScanner.fDocTypeReaderId);
            janSrc.fData = (InputSource *)CONCAT44(extraout_var,iVar7);
            if (janSrc.fData == (InputSource *)0x0) goto LAB_003425d0;
            Janitor<xercesc_4_0::InputSource>::reset
                      ((Janitor<xercesc_4_0::InputSource> *)&grammar,janSrc.fData);
            this_01 = (this->super_XMLScanner).fGrammarResolver;
            iVar7 = (*(janSrc.fData)->_vptr_InputSource[5])();
            pDVar13 = (DTDGrammar *)
                      GrammarResolver::getGrammar(this_01,(XMLCh *)CONCAT44(extraout_var_00,iVar7));
            if ((pDVar13 == (DTDGrammar *)0x0) ||
               (iVar7 = (*(pDVar13->super_Grammar).super_XSerializable._vptr_XSerializable[5])(),
               iVar7 != 0)) goto LAB_003425d0;
            this->fDTDGrammar = pDVar13;
            (this->super_XMLScanner).fGrammar = &this->fDTDGrammar->super_Grammar;
            pXVar3 = (this->super_XMLScanner).fValidator;
            (*pXVar3->_vptr_XMLValidator[0xb])(pXVar3,(this->super_XMLScanner).fGrammar);
            if ((this->super_XMLScanner).fDocTypeHandler != (DocTypeHandler *)0x0) {
              (*((this->super_XMLScanner).fDocTypeHandler)->_vptr_DocTypeHandler[0x10])();
              (*((this->super_XMLScanner).fDocTypeHandler)->_vptr_DocTypeHandler[10])();
            }
          }
          Janitor<xercesc_4_0::InputSource>::~Janitor((Janitor<xercesc_4_0::InputSource> *)&grammar)
          ;
        }
      }
      else {
        ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
        XMLScanner::checkInternalDTD
                  (&this->super_XMLScanner,hasExtSubset_00,pubId,
                   (XMLCh *)dtdScanner.fDocTypeReaderId);
        bVar5 = DTDScanner::scanInternalSubset((DTDScanner *)&bbPubId.fMgr);
        if (bVar5) {
          XVar12 = ReaderMgr::getReaderDepth(&(this->super_XMLScanner).fReaderMgr);
          if (1 < XVar12) {
            XMLScanner::emitError(&this->super_XMLScanner,PEPropogated);
            ReaderMgr::cleanStackBackTo(&(this->super_XMLScanner).fReaderMgr,1);
          }
          ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
          goto LAB_00342336;
        }
        ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
      }
      ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&srcUsed);
      ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&janPubId.fMemoryManager);
    }
    else {
      hasExtSubset_00 = true;
      (this->super_XMLScanner).fHasNoDTD = false;
      XMLBufBid::XMLBufBid((XMLBufBid *)&bbSysId.fMgr,&(this->super_XMLScanner).fBufMgr);
      XMLBufBid::XMLBufBid((XMLBufBid *)&janSysId.fMemoryManager,&(this->super_XMLScanner).fBufMgr);
      pXVar9 = XMLBufBid::getBuffer((XMLBufBid *)&bbSysId.fMgr);
      sysIdToFill = XMLBufBid::getBuffer((XMLBufBid *)&janSysId.fMemoryManager);
      bVar5 = DTDScanner::scanId((DTDScanner *)&bbPubId.fMgr,pXVar9,sysIdToFill,IDType_External);
      if (bVar5) {
        pXVar10 = XMLBufBid::getRawBuffer((XMLBufBid *)&bbSysId.fMgr);
        dtdScanner.fDocTypeReaderId =
             (XMLSize_t)XMLString::replicate(pXVar10,(this->super_XMLScanner).fMemoryManager);
        pXVar10 = XMLBufBid::getRawBuffer((XMLBufBid *)&janSysId.fMemoryManager);
        pubId = XMLString::replicate(pXVar10,(this->super_XMLScanner).fMemoryManager);
        ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
        XVar6 = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
        bVar4 = XVar6 == L'[';
      }
      else {
        ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
      }
      XMLBufBid::~XMLBufBid((XMLBufBid *)&janSysId.fMemoryManager);
      XMLBufBid::~XMLBufBid((XMLBufBid *)&bbSysId.fMgr);
      if (bVar5) goto LAB_00342199;
    }
    DTDScanner::~DTDScanner((DTDScanner *)&bbPubId.fMgr);
  }
  Janitor<xercesc_4_0::DTDElementDecl>::~Janitor((Janitor<xercesc_4_0::DTDElementDecl> *)&elemDecl);
LAB_00342a59:
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_28);
  return;
}

Assistant:

void DGXMLScanner::scanDocTypeDecl()
{
    if (fDocTypeHandler)
        fDocTypeHandler->resetDocType();

    // There must be some space after DOCTYPE
    bool skippedSomething;
    fReaderMgr.skipPastSpaces(skippedSomething);
    if (!skippedSomething)
    {
        emitError(XMLErrs::ExpectedWhitespace);

        // Just skip the Doctype declaration and return
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Get a buffer for the root element
    XMLBufBid bbRootName(&fBufMgr);

    //  Get a name from the input, which should be the name of the root
    //  element of the upcoming content.
    int  colonPosition;
    bool validName = fDoNamespaces ? fReaderMgr.getQName(bbRootName.getBuffer(), &colonPosition) :
                                     fReaderMgr.getName(bbRootName.getBuffer());
    if (!validName)
    {
        if (bbRootName.isEmpty())
            emitError(XMLErrs::NoRootElemInDOCTYPE);
        else
            emitError(XMLErrs::InvalidRootElemInDOCTYPE, bbRootName.getRawBuffer());
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    //  Store the root element name for later check
    setRootElemName(bbRootName.getRawBuffer());

    //  This element obviously is not going to exist in the element decl
    //  pool yet, but we need to call docTypeDecl. So force it into
    //  the element decl pool, marked as being there because it was in
    //  the DOCTYPE. Later, when its declared, the status will be updated.
    //
    //  Only do this if we are not reusing the validator! If we are reusing,
    //  then look it up instead. It has to exist!
    MemoryManager* const  rootDeclMgr =
        fUseCachedGrammar ? fMemoryManager : fGrammarPoolMemoryManager;

    DTDElementDecl* rootDecl = new (rootDeclMgr) DTDElementDecl
    (
        bbRootName.getRawBuffer()
        , fEmptyNamespaceId
        , DTDElementDecl::Any
        , rootDeclMgr
    );

    Janitor<DTDElementDecl> rootDeclJanitor(rootDecl);
    rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
    rootDecl->setExternalElemDeclaration(true);
    if(!fUseCachedGrammar)
    {
        fGrammar->putElemDecl(rootDecl);
        rootDeclJanitor.release();
    } else
    {
        // put this in the undeclared pool so it gets deleted...
        XMLElementDecl* elemDecl = fDTDElemNonDeclPool->getByKey(bbRootName.getRawBuffer());
        if (elemDecl)
        {
            rootDecl->setId(elemDecl->getId());
        }
        else
        {
            rootDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)rootDecl));
            rootDeclJanitor.release();
        }
    }

    // Skip any spaces after the name
    fReaderMgr.skipPastSpaces();

    //  And now if we are looking at a >, then we are done. It is not
    //  required to have an internal or external subset, though why you
    //  would not escapes me.
    if (fReaderMgr.skippedChar(chCloseAngle)) {

        //  If we have a doc type handler and advanced callbacks are enabled,
        //  call the doctype event.
        if (fDocTypeHandler)
            fDocTypeHandler->doctypeDecl(*rootDecl, 0, 0, false);
        return;
    }

    // either internal/external subset
    if (fValScheme == Val_Auto && !fValidate)
        fValidate = true;

    bool    hasIntSubset = false;
    bool    hasExtSubset = false;
    XMLCh*  sysId = 0;
    XMLCh*  pubId = 0;

    DTDScanner dtdScanner
    (
        (DTDGrammar*) fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    //  If the next character is '[' then we have no external subset cause
    //  there is no system id, just the opening character of the internal
    //  subset. Else, has to be an id.
    //
    // Just look at the next char, don't eat it.
    if (fReaderMgr.peekNextChar() == chOpenSquare)
    {
        hasIntSubset = true;
    }
    else
    {
        // Indicate we have an external subset
        hasExtSubset = true;
        fHasNoDTD = false;

        // Get buffers for the ids
        XMLBufBid bbPubId(&fBufMgr);
        XMLBufBid bbSysId(&fBufMgr);

        // Get the external subset id
        if (!dtdScanner.scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), DTDScanner::IDType_External))
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // Get copies of the ids we got
        pubId = XMLString::replicate(bbPubId.getRawBuffer(), fMemoryManager);
        sysId = XMLString::replicate(bbSysId.getRawBuffer(), fMemoryManager);

        // Skip spaces and check again for the opening of an internal subset
        fReaderMgr.skipPastSpaces();

        // Just look at the next char, don't eat it.
        if (fReaderMgr.peekNextChar() == chOpenSquare) {
            hasIntSubset = true;
        }
    }

    // Insure that the ids get cleaned up, if they got allocated
    ArrayJanitor<XMLCh> janSysId(sysId, fMemoryManager);
    ArrayJanitor<XMLCh> janPubId(pubId, fMemoryManager);

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler)
        fDocTypeHandler->doctypeDecl(*rootDecl, pubId, sysId, hasIntSubset, hasExtSubset);

    //  Ok, if we had an internal subset, we are just past the [ character
    //  and need to parse that first.
    if (hasIntSubset)
    {
        // Eat the opening square bracket
        fReaderMgr.getNextChar();

        checkInternalDTD(hasExtSubset, sysId, pubId);

        //  And try to scan the internal subset. If we fail, try to recover
        //  by skipping forward tot he close angle and returning.
        if (!dtdScanner.scanInternalSubset())
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        //  Do a sanity check that some expanded PE did not propogate out of
        //  the doctype. This could happen if it was terminated early by bad
        //  syntax.
        if (fReaderMgr.getReaderDepth() > 1)
        {
            emitError(XMLErrs::PEPropogated);

            // Ask the reader manager to pop back down to the main level
            fReaderMgr.cleanStackBackTo(1);
        }

        fReaderMgr.skipPastSpaces();
    }

    // And that should leave us at the closing > of the DOCTYPE line
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        //  Do a special check for the common scenario of an extra ] char at
        //  the end. This is easy to recover from.
        if (fReaderMgr.skippedChar(chCloseSquare)
        &&  fReaderMgr.skippedChar(chCloseAngle))
        {
            emitError(XMLErrs::ExtraCloseSquare);
        }
         else
        {
            emitError(XMLErrs::UnterminatedDOCTYPE);
            fReaderMgr.skipPastChar(chCloseAngle);
        }
    }

    //  If we had an external subset, then we need to deal with that one
    //  next. If we are reusing the validator, then don't scan it.
    if (hasExtSubset) {

        InputSource* srcUsed=0;
        Janitor<InputSource> janSrc(srcUsed);
        // If we had an internal subset and we're using the cached grammar, it
        // means that the ignoreCachedDTD is set, so we ignore the cached
        // grammar
        if (fUseCachedGrammar && !hasIntSubset)
        {
            srcUsed = resolveSystemId(sysId, pubId);
            if (srcUsed) {
                janSrc.reset(srcUsed);
                Grammar* grammar = fGrammarResolver->getGrammar(srcUsed->getSystemId());

                if (grammar && grammar->getGrammarType() == Grammar::DTDGrammarType) {

                    fDTDGrammar = (DTDGrammar*) grammar;
                    fGrammar = fDTDGrammar;
                    fValidator->setGrammar(fGrammar);
                    // If we don't report at least the external subset boundaries,
                    // an advanced document handler cannot know when the DTD end,
                    // since we've already sent a doctype decl that indicates there's
                    // there's an external subset.
                    if (fDocTypeHandler)
                    {
                        fDocTypeHandler->startExtSubset();
                        fDocTypeHandler->endExtSubset();
                    }

                    return;
                }
            }
        }

        if (fLoadExternalDTD || fValidate)
        {
            // And now create a reader to read this entity
            XMLReader* reader;
            if(srcUsed) {
                reader = fReaderMgr.createReader
                        (
                            *srcUsed
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , fCalculateSrcOfs
                            , fLowWaterMark
                        );
            }
            else {
                reader = fReaderMgr.createReader
                        (
                            sysId
                            , pubId
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , srcUsed
                            , fCalculateSrcOfs
                            , fLowWaterMark
                            , fDisableDefaultEntityResolution
                        );
                janSrc.reset(srcUsed);
            }
            //  If it failed then throw an exception
            if (!reader)
                ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Gen_CouldNotOpenDTD, srcUsed ? srcUsed->getSystemId() : sysId, fMemoryManager);

            if (fToCacheGrammar) {

                unsigned int stringId = fGrammarResolver->getStringPool()->addOrFind(srcUsed->getSystemId());
                const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(stringId);

                fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
                ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
                fGrammarResolver->putGrammar(fGrammar);
            }

            //  In order to make the processing work consistently, we have to
            //  make this look like an external entity. So create an entity
            //  decl and fill it in and push it with the reader, as happens
            //  with an external entity. Put a janitor on it to insure it gets
            //  cleaned up. The reader manager does not adopt them.
            const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
            DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
            declDTD->setSystemId(sysId);
            declDTD->setIsExternal(true);

            // Mark this one as a throw at end
            reader->setThrowAtEnd(true);

            // And push it onto the stack, with its pseudo name
            fReaderMgr.pushReaderAdoptEntity(reader, declDTD);

            // Tell it its not in an include section
            dtdScanner.scanExtSubsetDecl(false, true);
        }
    }
}